

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

df_solver_t * __thiscall
tchecker::clockbounds::df_solver_t::operator=(df_solver_t *this,df_solver_t *solver)

{
  clock_id_t cVar1;
  db_t *pdVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __n;
  
  if (this != solver) {
    cVar1 = solver->_clock_number;
    this->_loc_number = solver->_loc_number;
    this->_clock_number = cVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_loc_pid,&solver->_loc_pid);
    sVar4 = solver->_dim;
    this->_dim = sVar4;
    if (this->_L != (db_t *)0x0) {
      operator_delete__(this->_L);
      sVar4 = this->_dim;
    }
    uVar5 = sVar4 * sVar4;
    __n = uVar5 * 4;
    pdVar2 = (db_t *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | __n);
    this->_L = pdVar2;
    memcpy(pdVar2,solver->_L,__n);
    if (this->_U != (db_t *)0x0) {
      operator_delete__(this->_U);
      uVar5 = this->_dim * this->_dim;
      __n = uVar5 * 4;
    }
    uVar3 = 0xffffffffffffffff;
    if (uVar5 < 0x4000000000000000) {
      uVar3 = __n;
    }
    pdVar2 = (db_t *)operator_new__(uVar3);
    this->_U = pdVar2;
    memcpy(pdVar2,solver->_U,__n);
    this->_updated_L = solver->_updated_L;
    this->_updated_U = solver->_updated_U;
  }
  return this;
}

Assistant:

tchecker::clockbounds::df_solver_t & df_solver_t::operator=(tchecker::clockbounds::df_solver_t const & solver)
{
  if (this != &solver) {
    _loc_number = solver._loc_number;
    _clock_number = solver._clock_number;
    _loc_pid = solver._loc_pid;
    _dim = solver._dim;

    delete[] _L;
    _L = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_L, solver._L, _dim * _dim * sizeof(*_L));

    delete[] _U;
    _U = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_U, solver._U, _dim * _dim * sizeof(*_U));

    _updated_L = solver._updated_L;
    _updated_U = solver._updated_U;
  }

  return *this;
}